

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long slnum;
  int status;
  char *r;
  _Bool response;
  int ftpcode;
  ssize_t nread;
  timediff_t timeout_ms;
  anon_union_280_10_9f9d5394_for_proto *paStack_40;
  int socketstate;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_socket_t data_sock;
  curl_socket_t ctrl_sock;
  connectdata *conn;
  _Bool *received_local;
  Curl_easy *data_local;
  
  _data_sock = data->conn;
  ftpc._4_4_ = _data_sock->sock[0];
  ftpc._0_4_ = _data_sock->sock[1];
  paStack_40 = &_data_sock->proto;
  timeout_ms._4_4_ = 0;
  r._3_1_ = 0;
  *received = false;
  pp = (pingpong *)paStack_40;
  conn = (connectdata *)received;
  received_local = (_Bool *)data;
  nread = ftp_timeleft_accept(data);
  if (((received_local != (_Bool *)0x0) && ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0))
     && ((*(long *)(received_local + 0x1328) == 0 ||
         (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
    Curl_infof((Curl_easy *)received_local,"Checking for server connect");
  }
  if (nread < 0) {
    Curl_failf((Curl_easy *)received_local,"Accept timeout occurred while waiting server connect");
    data_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    sVar2 = Curl_dyn_len(&(paStack_40->ftpc).pp.recvbuf);
    if ((sVar2 == 0) || (pcVar3 = Curl_dyn_ptr(&(paStack_40->ftpc).pp.recvbuf), *pcVar3 < '4')) {
      if ((paStack_40->ftpc).pp.overflow == 0) {
        timeout_ms._4_4_ = Curl_socket_check(ftpc._4_4_,(curl_socket_t)ftpc,-1,0);
      }
      else {
        r._3_1_ = 1;
      }
      if (timeout_ms._4_4_ == 0xffffffff) {
        Curl_failf((Curl_easy *)received_local,"Error while waiting for server connect");
        data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
      }
      else {
        if (timeout_ms._4_4_ != 0) {
          if ((timeout_ms._4_4_ & 8) == 0) {
            if ((timeout_ms._4_4_ & 1) != 0) {
              r._3_1_ = 1;
            }
          }
          else {
            if (((received_local != (_Bool *)0x0) &&
                ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0)) &&
               ((*(long *)(received_local + 0x1328) == 0 ||
                (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
              Curl_infof((Curl_easy *)received_local,"Ready to accept data connection from server");
            }
            *(undefined1 *)&(conn->cpool_node)._list = 1;
          }
        }
        if ((r._3_1_ & 1) == 0) {
          data_local._4_4_ = CURLE_OK;
        }
        else {
          if (((received_local != (_Bool *)0x0) &&
              ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0)) &&
             ((*(long *)(received_local + 0x1328) == 0 ||
              (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
            Curl_infof((Curl_easy *)received_local,"Ctrl conn has data while waiting for data conn")
            ;
          }
          if (3 < (paStack_40->ftpc).pp.overflow) {
            pcVar3 = Curl_dyn_ptr(&(paStack_40->ftpc).pp.recvbuf);
            pcVar3 = pcVar3 + (paStack_40->ftpc).pp.nfinal;
            if ((((('/' < *pcVar3) && (*pcVar3 < ':')) && ('/' < pcVar3[1])) &&
                ((pcVar3[1] < ':' && ('/' < pcVar3[2])))) &&
               ((pcVar3[2] < ':' && (pcVar3[3] == ' ')))) {
              slnum = strtol(pcVar3,(char **)0x0,10);
              iVar1 = curlx_sltosi(slnum);
              if (iVar1 == 0xe2) {
                if (((received_local != (_Bool *)0x0) &&
                    ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0)) &&
                   ((*(long *)(received_local + 0x1328) == 0 ||
                    (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
                  Curl_infof((Curl_easy *)received_local,"Got 226 before data activity");
                }
                *(undefined1 *)&(conn->cpool_node)._list = 1;
                return CURLE_OK;
              }
            }
          }
          Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,
                              (int *)((long)&r + 4));
          if (((received_local != (_Bool *)0x0) &&
              ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0)) &&
             ((*(long *)(received_local + 0x1328) == 0 ||
              (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
            Curl_infof((Curl_easy *)received_local,"FTP code: %03d",(ulong)r._4_4_);
          }
          if ((int)r._4_4_ / 100 < 4) {
            data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
          }
          else {
            data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
          }
        }
      }
    }
    else {
      if (((received_local != (_Bool *)0x0) &&
          ((*(ulong *)(received_local + 0xa9a) >> 0x1c & 1) != 0)) &&
         ((*(long *)(received_local + 0x1328) == 0 ||
          (0 < *(int *)(*(long *)(received_local + 0x1328) + 8))))) {
        Curl_infof((Curl_easy *)received_local,
                   "There is negative response in cache while serv connect");
      }
      Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,
                          (int *)((long)&r + 4));
      data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int socketstate = 0;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;
  bool response = FALSE;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(Curl_dyn_len(&pp->recvbuf) && (*Curl_dyn_ptr(&pp->recvbuf) > '3')) {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  if(pp->overflow)
    /* there is pending control data still in the buffer to read */
    response = TRUE;
  else
    socketstate = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(socketstate) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:
    if(socketstate & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(socketstate & CURL_CSELECT_IN)
      response = TRUE;
    break;
  }
  if(response) {
    infof(data, "Ctrl conn has data while waiting for data conn");
    if(pp->overflow > 3) {
      char *r = Curl_dyn_ptr(&pp->recvbuf);

      DEBUGASSERT((pp->overflow + pp->nfinal) <=
                  Curl_dyn_len(&pp->recvbuf));
      /* move over the most recently handled response line */
      r += pp->nfinal;

      if(LASTLINE(r)) {
        int status = curlx_sltosi(strtol(r, NULL, 10));
        if(status == 226) {
          /* funny timing situation where we get the final message on the
             control connection before traffic on the data connection has been
             noticed. Leave the 226 in there and use this as a trigger to read
             the data socket. */
          infof(data, "Got 226 before data activity");
          *received = TRUE;
          return CURLE_OK;
        }
      }
    }

    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

    infof(data, "FTP code: %03d", ftpcode);

    if(ftpcode/100 > 3)
      return CURLE_FTP_ACCEPT_FAILED;

    return CURLE_WEIRD_SERVER_REPLY;
  }

  return CURLE_OK;
}